

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.h
# Opt level: O2

Mat * __thiscall
ncnn::Mat::reshape(Mat *__return_storage_ptr__,Mat *this,int _w,Allocator *_allocator)

{
  size_t sVar1;
  int iVar2;
  int i;
  long lVar3;
  
  if (this->h * this->w * this->c == _w) {
    if ((this->dims == 3) && (this->cstep != (long)this->h * (long)this->w)) {
      *(undefined8 *)((long)&__return_storage_ptr__->refcount + 4) = 0;
      *(undefined8 *)((long)&__return_storage_ptr__->elemsize + 4) = 0;
      __return_storage_ptr__->data = (void *)0x0;
      __return_storage_ptr__->refcount = (int *)0x0;
      __return_storage_ptr__->allocator = (Allocator *)0x0;
      __return_storage_ptr__->dims = 0;
      __return_storage_ptr__->w = 0;
      __return_storage_ptr__->h = 0;
      __return_storage_ptr__->c = 0;
      __return_storage_ptr__->cstep = 0;
      create(__return_storage_ptr__,_w,this->elemsize,this->elempack,_allocator);
      for (lVar3 = 0; lVar3 < this->c; lVar3 = lVar3 + 1) {
        sVar1 = this->elemsize;
        iVar2 = this->h * this->w;
        memcpy((void *)((long)((int)lVar3 * iVar2) * sVar1 + (long)__return_storage_ptr__->data),
               (void *)(this->cstep * lVar3 * sVar1 + (long)this->data),(long)iVar2 * sVar1);
      }
    }
    else {
      Mat(__return_storage_ptr__,this);
      __return_storage_ptr__->dims = 1;
      __return_storage_ptr__->w = _w;
      __return_storage_ptr__->h = 1;
      __return_storage_ptr__->c = 1;
      __return_storage_ptr__->cstep = (long)_w;
    }
  }
  else {
    *(undefined8 *)((long)&__return_storage_ptr__->refcount + 4) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->elemsize + 4) = 0;
    __return_storage_ptr__->data = (void *)0x0;
    __return_storage_ptr__->refcount = (int *)0x0;
    __return_storage_ptr__->allocator = (Allocator *)0x0;
    __return_storage_ptr__->dims = 0;
    __return_storage_ptr__->w = 0;
    __return_storage_ptr__->h = 0;
    __return_storage_ptr__->c = 0;
    __return_storage_ptr__->cstep = 0;
  }
  return __return_storage_ptr__;
}

Assistant:

inline Mat Mat::reshape(int _w, Allocator* _allocator) const
{
    if (w * h * c != _w)
        return Mat();

    if (dims == 3 && cstep != (size_t)w * h)
    {
        Mat m;
        m.create(_w, elemsize, elempack, _allocator);

        // flatten
        for (int i=0; i<c; i++)
        {
            const void* ptr = (unsigned char*)data + i * cstep * elemsize;
            void* mptr = (unsigned char*)m.data + i * w * h * elemsize;
            memcpy(mptr, ptr, w * h * elemsize);
        }

        return m;
    }

    Mat m = *this;

    m.dims = 1;
    m.w = _w;
    m.h = 1;
    m.c = 1;

    m.cstep = _w;

    return m;
}